

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

int parse_destination_token(Context_conflict2 *ctx)

{
  int *piVar1;
  RegisterType *rtype;
  char cVar2;
  MOJOSHADER_shaderType MVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  RegisterType RVar9;
  bool bVar10;
  int iVar11;
  Token TVar12;
  Token TVar13;
  int extraout_EAX;
  ulong in_RAX;
  char *pcVar14;
  size_t __n;
  bool bVar15;
  char tokenbytes [5];
  undefined8 local_38;
  
  pcVar14 = (char *)&local_38;
  (ctx->dest_arg).writemask3 = 0;
  (ctx->dest_arg).orig_writemask = 0;
  (ctx->dest_arg).result_mod = 0;
  (ctx->dest_arg).result_shift = 0;
  (ctx->dest_arg).writemask = 0;
  (ctx->dest_arg).writemask0 = 0;
  (ctx->dest_arg).writemask1 = 0;
  (ctx->dest_arg).writemask2 = 0;
  (ctx->dest_arg).token = (uint32 *)0x0;
  (ctx->dest_arg).regnum = 0;
  (ctx->dest_arg).relative = 0;
  *(undefined8 *)&(ctx->dest_arg).regtype = 0;
  local_38 = in_RAX;
  if (ctx->tokenlen == 0) {
    bVar15 = true;
  }
  else {
    bVar10 = false;
    do {
      iVar11 = check_token_segment(ctx,"_x2");
      if (iVar11 == 0) {
        iVar11 = check_token_segment(ctx,"_x4");
        if (iVar11 == 0) {
          iVar11 = check_token_segment(ctx,"_x8");
          if (iVar11 == 0) {
            iVar11 = check_token_segment(ctx,"_d8");
            if (iVar11 == 0) {
              iVar11 = check_token_segment(ctx,"_d4");
              if (iVar11 == 0) {
                iVar11 = check_token_segment(ctx,"_d2");
                if (iVar11 == 0) {
                  iVar11 = check_token_segment(ctx,"_sat");
                  if (iVar11 == 0) {
                    iVar11 = check_token_segment(ctx,"_pp");
                    if (iVar11 == 0) {
                      iVar11 = check_token_segment(ctx,"_centroid");
                      if (iVar11 == 0) {
                        bVar10 = true;
                      }
                      else {
                        piVar1 = &(ctx->dest_arg).result_mod;
                        *(byte *)piVar1 = (byte)*piVar1 | 4;
                      }
                    }
                    else {
                      piVar1 = &(ctx->dest_arg).result_mod;
                      *(byte *)piVar1 = (byte)*piVar1 | 2;
                    }
                  }
                  else {
                    piVar1 = &(ctx->dest_arg).result_mod;
                    *(byte *)piVar1 = (byte)*piVar1 | 1;
                  }
                }
                else {
                  if ((ctx->dest_arg).result_shift != 0) {
                    failf(ctx,"%s","Multiple result shift modifiers");
                  }
                  (ctx->dest_arg).result_shift = 0xf;
                }
              }
              else {
                if ((ctx->dest_arg).result_shift != 0) {
                  failf(ctx,"%s","Multiple result shift modifiers");
                }
                (ctx->dest_arg).result_shift = 0xe;
              }
            }
            else {
              if ((ctx->dest_arg).result_shift != 0) {
                failf(ctx,"%s","Multiple result shift modifiers");
              }
              (ctx->dest_arg).result_shift = 0xd;
            }
          }
          else {
            if ((ctx->dest_arg).result_shift != 0) {
              failf(ctx,"%s","Multiple result shift modifiers");
            }
            (ctx->dest_arg).result_shift = 3;
          }
        }
        else {
          if ((ctx->dest_arg).result_shift != 0) {
            failf(ctx,"%s","Multiple result shift modifiers");
          }
          (ctx->dest_arg).result_shift = 2;
        }
      }
      else {
        if ((ctx->dest_arg).result_shift != 0) {
          failf(ctx,"%s","Multiple result shift modifiers");
        }
        (ctx->dest_arg).result_shift = 1;
      }
      bVar15 = !bVar10;
    } while ((ctx->tokenlen != 0) && (!bVar10));
  }
  if (!bVar15) {
    failf(ctx,"%s","Invalid destination modifier");
  }
  TVar12 = nexttoken(ctx);
  if (TVar12 == 0x28) {
    failf(ctx,"%s","Predicates unsupported at this time");
  }
  if (ctx->pushedback != 0) {
LAB_001510b6:
    __assert_fail("!ctx->pushedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_assembler.c"
                  ,0x9f,"void pushback(Context *)");
  }
  ctx->pushedback = 1;
  rtype = &(ctx->dest_arg).regtype;
  piVar1 = &(ctx->dest_arg).regnum;
  parse_register_name(ctx,rtype,piVar1);
  if (ctx->tokenlen != 0) {
    failf(ctx,"%s","invalid register name");
  }
  TVar12 = nexttoken(ctx);
  if (TVar12 != 0x2e) {
    (ctx->dest_arg).writemask = 0xf;
    (ctx->dest_arg).writemask0 = 1;
    (ctx->dest_arg).writemask3 = 1;
    (ctx->dest_arg).writemask1 = 1;
    (ctx->dest_arg).writemask2 = 1;
    if (ctx->pushedback != 0) goto LAB_001510b6;
    ctx->pushedback = 1;
    goto LAB_00150fb4;
  }
  RVar9 = *rtype;
  MVar3 = *piVar1;
  bVar15 = true;
  switch(RVar9) {
  case REG_TYPE_DEPTHOUT:
  case REG_TYPE_CONSTBOOL:
  case REG_TYPE_LOOP:
    break;
  case REG_TYPE_SAMPLER:
  case REG_TYPE_CONST2:
  case REG_TYPE_CONST3:
  case REG_TYPE_CONST4:
  case REG_TYPE_TEMPFLOAT16:
  case REG_TYPE_LABEL:
switchD_00150e7c_caseD_a:
    bVar15 = false;
    break;
  case REG_TYPE_MISCTYPE:
    goto LAB_00150e9a;
  case REG_TYPE_MAX:
    MVar3 = ctx->shader_type;
LAB_00150e9a:
    bVar15 = MVar3 == MOJOSHADER_TYPE_PIXEL;
    break;
  default:
    if (RVar9 != REG_TYPE_RASTOUT) goto switchD_00150e7c_caseD_a;
    bVar15 = MVar3 - MOJOSHADER_TYPE_PIXEL < 2;
  }
  if ((RVar9 == REG_TYPE_DEPTHOUT) || (!bVar15)) {
    TVar13 = nexttoken(ctx);
    if (TVar13 == TOKEN_IDENTIFIER) {
      local_38 = local_38 & 0xffffff0000000000;
      __n = 4;
      if (ctx->tokenlen < 4) {
        __n = (size_t)ctx->tokenlen;
      }
      memcpy(&local_38,ctx->token,__n);
      if (((char)local_38 == 'x') || ((char)local_38 == 'r')) {
        (ctx->dest_arg).writemask0 = 1;
        pcVar14 = (char *)((long)&local_38 + 1);
      }
      if ((*pcVar14 == 'y') || (*pcVar14 == 'g')) {
        (ctx->dest_arg).writemask1 = 1;
        pcVar14 = pcVar14 + 1;
      }
      if ((*pcVar14 == 'z') || (*pcVar14 == 'b')) {
        (ctx->dest_arg).writemask2 = 1;
        pcVar14 = pcVar14 + 1;
      }
      if ((*pcVar14 == 'w') || (*pcVar14 == 'a')) {
        (ctx->dest_arg).writemask3 = 1;
        pcVar14 = pcVar14 + 1;
      }
      cVar2 = *pcVar14;
      (ctx->dest_arg).writemask =
           ((ctx->dest_arg).writemask0 & 1U) + ((ctx->dest_arg).writemask1 & 1U) * 2 +
           ((ctx->dest_arg).writemask2 & 1U) * 4 + ((ctx->dest_arg).writemask3 & 1U) * 8;
      if (cVar2 == '\0') goto LAB_00150fb4;
    }
    pcVar14 = "Invalid writemask";
  }
  else {
    pcVar14 = "Writemask specified for scalar register";
  }
  failf(ctx,"%s",pcVar14);
LAB_00150fb4:
  if (((TVar12 == 0x2e) && (*rtype == REG_TYPE_DEPTHOUT)) &&
     (1 < (ctx->dest_arg).writemask1 + (ctx->dest_arg).writemask0 + (ctx->dest_arg).writemask2 +
          (ctx->dest_arg).writemask3)) {
    failf(ctx,"%s","Writemask specified for scalar register");
  }
  iVar11 = ctx->tokenbufpos;
  (ctx->dest_arg).orig_writemask = (ctx->dest_arg).writemask;
  if (0xf < iVar11) {
    failf(ctx,"%s","Too many tokens");
    return extraout_EAX;
  }
  uVar4 = (ctx->dest_arg).regnum;
  uVar5 = (ctx->dest_arg).relative;
  uVar6 = (ctx->dest_arg).writemask;
  uVar7 = (ctx->dest_arg).result_mod;
  uVar8 = (ctx->dest_arg).result_shift;
  RVar9 = (ctx->dest_arg).regtype;
  iVar11 = ctx->tokenbufpos;
  ctx->tokenbufpos = iVar11 + 1;
  ctx->tokenbuf[iVar11] =
       (RVar9 & (REG_TYPE_TEMPFLOAT16|REG_TYPE_COLOROUT)) << 8 |
       RVar9 << 0x1c |
       (uVar6 & 0xf) << 0x10 |
       (uVar8 & 0xf) << 0x18 | (uVar7 & 0xf) << 0x14 | (uVar5 & 1) << 0xd | uVar4 & 0x7ff |
       0x80000000;
  return iVar11;
}

Assistant:

static int parse_destination_token(Context *ctx, DestArgInfo *info)
{
    // !!! FIXME: recheck against the spec for ranges (like RASTOUT values, etc).
    if (ctx->tokencount == 0)
    {
        fail(ctx, "Out of tokens in destination parameter");
        return 0;
    } // if

    const uint32 token = SWAP32(*(ctx->tokens));
    const int reserved1 = (int) ((token >> 14) & 0x3); // bits 14 through 15
    const int reserved2 = (int) ((token >> 31) & 0x1); // bit 31

    info->token = ctx->tokens;
    info->regnum = (int) (token & 0x7ff);  // bits 0 through 10
    info->relative = (int) ((token >> 13) & 0x1); // bit 13
    info->orig_writemask = (int) ((token >> 16) & 0xF); // bits 16 through 19
    info->result_mod = (int) ((token >> 20) & 0xF); // bits 20 through 23
    info->result_shift = (int) ((token >> 24) & 0xF); // bits 24 through 27      abc
    info->regtype = (RegisterType) (((token >> 28) & 0x7) | ((token >> 8) & 0x18));  // bits 28-30, 11-12

    int writemask;
    if (isscalar(ctx, ctx->shader_type, info->regtype, info->regnum))
        writemask = 0x1;  // just x.
    else
        writemask = info->orig_writemask;

    set_dstarg_writemask(info, writemask);  // bits 16 through 19.

    // all the REG_TYPE_CONSTx types are the same register type, it's just
    //  split up so its regnum can be > 2047 in the bytecode. Clean it up.
    if (info->regtype == REG_TYPE_CONST2)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 2048;
    } // else if
    else if (info->regtype == REG_TYPE_CONST3)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 4096;
    } // else if
    else if (info->regtype == REG_TYPE_CONST4)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 6144;
    } // else if

    // swallow token for now, for multiple calls in a row.
    adjust_token_position(ctx, 1);

    if (reserved1 != 0x0)
        fail(ctx, "Reserved bit #1 in destination token must be zero");

    if (reserved2 != 0x1)
        fail(ctx, "Reserved bit #2 in destination token must be one");

    if (info->relative)
    {
        if (!shader_is_vertex(ctx))
            fail(ctx, "Relative addressing in non-vertex shader");
        if (!shader_version_atleast(ctx, 3, 0))
            fail(ctx, "Relative addressing in vertex shader version < 3.0");
        if ((!ctx->ctab.have_ctab) && (!ctx->ignores_ctab))
        {
            // it's hard to do this efficiently without!
            fail(ctx, "relative addressing unsupported without a CTAB");
        } // if

        // !!! FIXME: I don't have a shader that has a relative dest currently.
        fail(ctx, "Relative addressing of dest tokens is unsupported");
        return 2;
    } // if

    const int s = info->result_shift;
    if (s != 0)
    {
        if (!shader_is_pixel(ctx))
            fail(ctx, "Result shift scale in non-pixel shader");
        if (shader_version_atleast(ctx, 2, 0))
            fail(ctx, "Result shift scale in pixel shader version >= 2.0");
        if ( ! (((s >= 1) && (s <= 3)) || ((s >= 0xD) && (s <= 0xF))) )
            fail(ctx, "Result shift scale isn't 1 to 3, or 13 to 15.");
    } // if

    if (info->result_mod & MOD_PP)  // Partial precision (pixel shaders only)
    {
        if (!shader_is_pixel(ctx))
            fail(ctx, "Partial precision result mod in non-pixel shader");
    } // if

    if (info->result_mod & MOD_CENTROID)  // Centroid (pixel shaders only)
    {
        if (!shader_is_pixel(ctx))
            fail(ctx, "Centroid result mod in non-pixel shader");
        else if (!ctx->centroid_allowed)  // only on DCL opcodes!
            fail(ctx, "Centroid modifier not allowed here");
    } // if

    if (/*(info->regtype < 0) ||*/ (info->regtype > REG_TYPE_MAX))
        fail(ctx, "Register type is out of range");

    if (!isfail(ctx))
        set_used_register(ctx, info->regtype, info->regnum, 1);

    return 1;
}